

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_stereo_pan_pcm_frames_f32(float *pFramesOut,float *pFramesIn,ma_uint64 frameCount,float pan)

{
  float fVar1;
  float fVar2;
  float sample1_1;
  float sample0_1;
  float factorR1;
  float factorR0;
  float sample1;
  float sample0;
  float factorL1;
  float factorL0;
  ma_uint64 iFrame;
  float pan_local;
  ma_uint64 frameCount_local;
  float *pFramesIn_local;
  float *pFramesOut_local;
  
  if (pan <= 0.0) {
    for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
      fVar1 = pFramesIn[iFrame * 2 + 1];
      pFramesOut[iFrame * 2] = pFramesIn[iFrame * 2 + 1] * (0.0 - pan) + pFramesIn[iFrame * 2];
      pFramesOut[iFrame * 2 + 1] = fVar1 * (pan + 1.0);
    }
  }
  else {
    for (iFrame = 0; iFrame < frameCount; iFrame = iFrame + 1) {
      fVar1 = pFramesIn[iFrame * 2];
      fVar2 = pFramesIn[iFrame * 2 + 1];
      pFramesOut[iFrame * 2] = pFramesIn[iFrame * 2] * (1.0 - pan);
      pFramesOut[iFrame * 2 + 1] = fVar1 * (pan + 0.0) + fVar2;
    }
  }
  return;
}

Assistant:

static void ma_stereo_pan_pcm_frames_f32(float* pFramesOut, const float* pFramesIn, ma_uint64 frameCount, float pan)
{
    ma_uint64 iFrame;

    if (pan > 0) {
        float factorL0 = 1.0f - pan;
        float factorL1 = 0.0f + pan;

        for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
            float sample0 = (pFramesIn[iFrame*2 + 0] * factorL0);
            float sample1 = (pFramesIn[iFrame*2 + 0] * factorL1) + pFramesIn[iFrame*2 + 1];

            pFramesOut[iFrame*2 + 0] = sample0;
            pFramesOut[iFrame*2 + 1] = sample1;
        }
    } else {
        float factorR0 = 0.0f - pan;
        float factorR1 = 1.0f + pan;

        for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
            float sample0 = pFramesIn[iFrame*2 + 0] + (pFramesIn[iFrame*2 + 1] * factorR0);
            float sample1 =                           (pFramesIn[iFrame*2 + 1] * factorR1);

            pFramesOut[iFrame*2 + 0] = sample0;
            pFramesOut[iFrame*2 + 1] = sample1;
        }
    }
}